

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_SVM_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_00749700 == '\x01') {
    DAT_00749700 = '\0';
    (*(code *)*_LinearKernel_default_instance_)();
  }
  if (DAT_00749728 == '\x01') {
    DAT_00749728 = '\0';
    (*(code *)*_RBFKernel_default_instance_)();
  }
  if (DAT_00749758 == '\x01') {
    DAT_00749758 = '\0';
    (*(code *)*_PolyKernel_default_instance_)();
  }
  if (DAT_00749788 == '\x01') {
    DAT_00749788 = '\0';
    (*(code *)*_SigmoidKernel_default_instance_)();
  }
  if (DAT_007497b0 == '\x01') {
    DAT_007497b0 = '\0';
    (*(code *)*_Kernel_default_instance_)();
  }
  if (DAT_007497f8 == '\x01') {
    DAT_007497f8 = '\0';
    (*(code *)*_SparseNode_default_instance_)();
  }
  if (DAT_00749830 == '\x01') {
    DAT_00749830 = '\0';
    (*(code *)*_SparseVector_default_instance_)();
  }
  if (DAT_00749868 == '\x01') {
    DAT_00749868 = '\0';
    (*(code *)*_SparseSupportVectors_default_instance_)();
  }
  if (DAT_00749898 == '\x01') {
    DAT_00749898 = '\0';
    (*(code *)*_DenseVector_default_instance_)();
  }
  if (DAT_007498d0 == '\x01') {
    DAT_007498d0 = '\0';
    (*(code *)*_DenseSupportVectors_default_instance_)();
  }
  if (DAT_00749900 == '\x01') {
    DAT_00749900 = '\0';
    (*(code *)*_Coefficients_default_instance_)();
  }
  if (DAT_00749940 == '\x01') {
    DAT_00749940 = '\0';
    (*(code *)*_SupportVectorRegressor_default_instance_)();
  }
  if (DAT_00749a08 == '\x01') {
    DAT_00749a08 = 0;
    (*(code *)*_SupportVectorClassifier_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _LinearKernel_default_instance_.Shutdown();
  _RBFKernel_default_instance_.Shutdown();
  _PolyKernel_default_instance_.Shutdown();
  _SigmoidKernel_default_instance_.Shutdown();
  _Kernel_default_instance_.Shutdown();
  _SparseNode_default_instance_.Shutdown();
  _SparseVector_default_instance_.Shutdown();
  _SparseSupportVectors_default_instance_.Shutdown();
  _DenseVector_default_instance_.Shutdown();
  _DenseSupportVectors_default_instance_.Shutdown();
  _Coefficients_default_instance_.Shutdown();
  _SupportVectorRegressor_default_instance_.Shutdown();
  _SupportVectorClassifier_default_instance_.Shutdown();
}